

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountedObject.cpp
# Opt level: O0

List * __thiscall
jbcoin::CountedObjects::getCounts_abi_cxx11_
          (List *__return_storage_ptr__,CountedObjects *this,int minimumThreshold)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_80 [8];
  Entry entry;
  CounterBase *counter;
  int count;
  int minimumThreshold_local;
  CountedObjects *this_local;
  List *counts;
  memory_order __b;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::vector(__return_storage_ptr__);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::reserve(__return_storage_ptr__,(long)(this->m_count).super___atomic_base<int>._M_i);
  for (entry._32_8_ = std::atomic<jbcoin::CountedObjects::CounterBase_*>::load
                                (&this->m_head,memory_order_seq_cst); entry._32_8_ != 0;
      entry._32_8_ = CounterBase::getNext((CounterBase *)entry._32_8_)) {
    iVar1 = CounterBase::getCount((CounterBase *)entry._32_8_);
    if (minimumThreshold <= iVar1) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  *)local_80);
      pcVar2 = (char *)(**(code **)(*(long *)entry._32_8_ + 0x10))();
      std::__cxx11::string::operator=((string *)local_80,pcVar2);
      entry.first.field_2._8_4_ = CounterBase::getCount((CounterBase *)entry._32_8_);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_80);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)local_80);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CountedObjects::List CountedObjects::getCounts (int minimumThreshold) const
{
    List counts;

    // When other operations are concurrent, the count
    // might be temporarily less than the actual count.
    int const count = m_count.load ();

    counts.reserve (count);

    CounterBase* counter = m_head.load ();

    while (counter != nullptr)
    {
        if (counter->getCount () >= minimumThreshold)
        {
            Entry entry;

            entry.first = counter->getName ();
            entry.second = counter->getCount ();

            counts.push_back (entry);
        }

        counter = counter->getNext ();
    }

    return counts;
}